

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapySDRUtil.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  mapped_type *this;
  undefined8 in_RSI;
  undefined4 in_EDI;
  string *in_stack_00000028;
  string *in_stack_00000030;
  string *in_stack_00000038;
  double in_stack_00000040;
  string *in_stack_00000048;
  Kwargs args;
  int option;
  int long_index;
  bool watchDeviceFlag;
  bool probeDeviceFlag;
  bool makeDeviceFlag;
  bool sparsePrintFlag;
  bool findDevicesFlag;
  string driverName;
  double sampleRate;
  string dirStr;
  string chanStr;
  string formatStr;
  string argStr;
  string serial;
  ModuleManager mm;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  allocator *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  map local_1a0 [8];
  string *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe78;
  allocator local_179;
  string *in_stack_fffffffffffffe88;
  string local_158 [55];
  allocator local_121;
  string local_120 [32];
  undefined4 local_100;
  string *in_stack_ffffffffffffff08;
  undefined4 local_ec;
  byte local_e5;
  byte local_e4;
  byte local_e3;
  byte local_e2;
  byte local_e1;
  string local_e0 [32];
  double local_c0;
  string local_b8 [32];
  string local_98 [23];
  undefined1 in_stack_ffffffffffffff7f;
  string *in_stack_ffffffffffffff80;
  string local_78 [32];
  string local_58 [32];
  string local_38 [39];
  ModuleManager local_11;
  undefined8 local_10;
  undefined4 local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  SoapySDR::ModuleManager::ModuleManager(&local_11,false);
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::string(local_58);
  std::__cxx11::string::string(local_78);
  std::__cxx11::string::string(local_98);
  std::__cxx11::string::string(local_b8);
  local_c0 = 0.0;
  std::__cxx11::string::string(local_e0);
  local_e1 = 0;
  local_e2 = 0;
  local_e3 = 0;
  local_e4 = 0;
  local_e5 = 0;
  local_ec = 0;
  while (iVar2 = getopt_long_only(local_8,local_10,"",main::long_options,&local_ec),
        pcVar1 = _optarg, iVar2 != -1) {
    switch(iVar2) {
    case 0x53:
      std::__cxx11::string::operator=(local_38,_optarg);
      break;
    case 0x61:
      if (_optarg != (char *)0x0) {
        std::__cxx11::string::operator=(local_58,_optarg);
      }
      break;
    case 99:
      if (_optarg != (char *)0x0) {
        std::__cxx11::string::operator=(local_e0,_optarg);
      }
      break;
    case 100:
      if (_optarg != (char *)0x0) {
        std::__cxx11::string::operator=(local_b8,_optarg);
      }
      break;
    case 0x66:
      local_e1 = 1;
      if (_optarg != (char *)0x0) {
        std::__cxx11::string::operator=(local_58,_optarg);
      }
      break;
    case 0x68:
      printBanner();
      local_4 = printHelp();
      goto LAB_00106eef;
    case 0x69:
      printBanner();
      local_4 = printInfo();
      goto LAB_00106eef;
    case 0x6d:
      local_e3 = 1;
      if (_optarg != (char *)0x0) {
        std::__cxx11::string::operator=(local_58,_optarg);
      }
      break;
    case 0x6e:
      if (_optarg != (char *)0x0) {
        std::__cxx11::string::operator=(local_98,_optarg);
      }
      break;
    case 0x70:
      local_e4 = 1;
      if (_optarg != (char *)0x0) {
        std::__cxx11::string::operator=(local_58,_optarg);
      }
      break;
    case 0x72:
      if (_optarg != (char *)0x0) {
        in_stack_fffffffffffffe48 = &local_121;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_120,pcVar1,in_stack_fffffffffffffe48);
        local_c0 = std::__cxx11::stod((string *)
                                      CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                      (size_t *)
                                      CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08))
        ;
        std::__cxx11::string::~string(local_120);
        std::allocator<char>::~allocator((allocator<char> *)&local_121);
      }
      break;
    case 0x73:
      local_e2 = 1;
      break;
    case 0x74:
      if (_optarg != (char *)0x0) {
        std::__cxx11::string::operator=(local_78,_optarg);
      }
      break;
    case 0x77:
      local_e5 = 1;
      if (_optarg != (char *)0x0) {
        std::__cxx11::string::operator=(local_58,_optarg);
      }
    }
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    SoapySDR::KwargsFromString(local_158);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xfffffffffffffe88,"serial",&local_179);
    this = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                        (key_type *)in_stack_fffffffffffffe48);
    std::__cxx11::string::operator=((string *)this,local_38);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe88);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
    SoapySDR::KwargsToString(local_1a0);
    std::__cxx11::string::operator=(local_58,(string *)local_1a0);
    std::__cxx11::string::~string((string *)local_1a0);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x106cc4);
  }
  if ((local_e2 & 1) == 0) {
    printBanner();
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    local_4 = checkDriver(in_stack_fffffffffffffe88);
  }
  else if ((local_e1 & 1) == 0) {
    if ((local_e3 & 1) == 0) {
      if ((local_e4 & 1) == 0) {
        if ((local_e5 & 1) == 0) {
          if ((local_c0 != 0.0) || (NAN(local_c0))) {
            local_4 = SoapySDRRateTest(in_stack_00000048,in_stack_00000040,in_stack_00000038,
                                       in_stack_00000030,in_stack_00000028);
          }
          else {
            local_4 = printHelp();
          }
        }
        else {
          local_4 = watchDevice(in_stack_fffffffffffffe78);
        }
      }
      else {
        local_4 = probeDevice(in_stack_fffffffffffffe68);
      }
    }
    else {
      local_4 = makeDevice(in_stack_ffffffffffffff08);
    }
  }
  else {
    local_4 = findDevices(in_stack_ffffffffffffff80,(bool)in_stack_ffffffffffffff7f);
  }
LAB_00106eef:
  local_100 = 1;
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  SoapySDR::ModuleManager::~ModuleManager(&local_11);
  return local_4;
}

Assistant:

int main(int argc, char *argv[])
{
    //unload any loaded modules when main() scope unwinds
    SoapySDR::ModuleManager mm(false);

    std::string serial;
    std::string argStr;
    std::string formatStr;
    std::string chanStr;
    std::string dirStr;
    double sampleRate(0.0);
    std::string driverName;
    bool findDevicesFlag(false);
    bool sparsePrintFlag(false);
    bool makeDeviceFlag(false);
    bool probeDeviceFlag(false);
    bool watchDeviceFlag(false);

    /*******************************************************************
     * parse command line options
     ******************************************************************/
    static struct option long_options[] = {
        {"help", no_argument, nullptr, 'h'},
        {"find", optional_argument, nullptr, 'f'},
        {"make", optional_argument, nullptr, 'm'},
        {"info", optional_argument, nullptr, 'i'},
        {"probe", optional_argument, nullptr, 'p'},
        {"watch", optional_argument, nullptr, 'w'},

        {"check", optional_argument, nullptr, 'c'},
        {"sparse", no_argument, nullptr, 's'},
        {"serial", required_argument, nullptr, 'S'},

        {"args", optional_argument, nullptr, 'a'},
        {"rate", optional_argument, nullptr, 'r'},
        {"format", optional_argument, nullptr, 't'},
        {"channels", optional_argument, nullptr, 'n'},
        {"direction", optional_argument, nullptr, 'd'},
        {nullptr, no_argument, nullptr, '\0'}
    };
    int long_index = 0;
    int option = 0;
    while ((option = getopt_long_only(argc, argv, "", long_options, &long_index)) != -1)
    {
        switch (option)
        {
        case 'h':
            printBanner();
            return printHelp();
        case 'i':
            printBanner();
            return printInfo();
        case 'f':
            findDevicesFlag = true;
            if (optarg != nullptr) argStr = optarg;
            break;
        case 'm':
            makeDeviceFlag = true;
            if (optarg != nullptr) argStr = optarg;
            break;
        case 'p':
            probeDeviceFlag = true;
            if (optarg != nullptr) argStr = optarg;
            break;
        case 'w':
            watchDeviceFlag = true;
            if (optarg != nullptr) argStr = optarg;
            break;
        case 'c':
            if (optarg != nullptr) driverName = optarg;
            break;
        case 's':
            sparsePrintFlag = true;
            break;
        case 'S':
            serial = optarg;
            break;
        case 'a':
            if (optarg != nullptr) argStr = optarg;
            break;
        case 'r':
            if (optarg != nullptr) sampleRate = std::stod(optarg);
            break;
        case 't':
            if (optarg != nullptr) formatStr = optarg;
            break;
        case 'n':
            if (optarg != nullptr) chanStr = optarg;
            break;
        case 'd':
            if (optarg != nullptr) dirStr = optarg;
            break;
        }
    }

    //use serial if provided
    if (not serial.empty())
    {
        auto args = SoapySDR::KwargsFromString(argStr);
        args["serial"] = serial;
        argStr = SoapySDR::KwargsToString(args);
    }

    if (not sparsePrintFlag) printBanner();
    if (not driverName.empty()) return checkDriver(driverName);
    if (findDevicesFlag) return findDevices(argStr, sparsePrintFlag);
    if (makeDeviceFlag)  return makeDevice(argStr);
    if (probeDeviceFlag) return probeDevice(argStr);
    if (watchDeviceFlag) return watchDevice(argStr);

    //invoke utilities that rely on multiple arguments
    if (sampleRate != 0.0)
    {
        return SoapySDRRateTest(argStr, sampleRate, formatStr, chanStr, dirStr);
    }

    //unknown or unspecified options, do help...
    return printHelp();
}